

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O3

OutputFile * __thiscall re2c::OutputFile::wraw(OutputFile *this,char *s,size_t n)

{
  std::ostream::write((char *)&((this->blocks).
                                super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1]->fragments).
                               super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-1]->stream,(long)s);
  return this;
}

Assistant:

OutputFile & OutputFile::wraw (const char * s, size_t n)
{
	stream ().write (s, static_cast<std::streamsize> (n));
	return *this;
}